

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void mi_debug_show_arenas(void)

{
  mi_arena_t *pmVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  size_t field_count;
  char *pcVar5;
  size_t sVar6;
  mi_arena_t **ppmVar7;
  
  sVar2 = mi_arena_count;
  if (mi_arena_count == 0) {
    lVar4 = 0;
  }
  else {
    ppmVar7 = mi_arenas;
    lVar4 = 0;
    sVar6 = 0;
    do {
      pmVar1 = *ppmVar7;
      if (pmVar1 == (mi_arena_t *)0x0) break;
      field_count = pmVar1->field_count;
      pcVar5 = "";
      if ((pmVar1->memid).is_pinned != false) {
        pcVar5 = ", pinned";
      }
      _mi_message("arena %zu: %zu blocks of size %zuMiB (in %zu fields) %s\n",sVar6,
                  pmVar1->block_count,0x20,field_count,pcVar5);
      sVar3 = mi_debug_show_bitmap
                        ("inuse blocks",(char *)pmVar1->block_count,(size_t)pmVar1->blocks_inuse,
                         (mi_bitmap_field_t *)pmVar1->field_count,field_count);
      if (pmVar1->blocks_committed != (mi_bitmap_field_t *)0x0) {
        mi_debug_show_bitmap
                  ("committed blocks",(char *)pmVar1->block_count,(size_t)pmVar1->blocks_committed,
                   (mi_bitmap_field_t *)pmVar1->field_count,field_count);
      }
      lVar4 = lVar4 + sVar3;
      sVar6 = sVar6 + 1;
      ppmVar7 = ppmVar7 + 1;
    } while (sVar2 != sVar6);
  }
  _mi_message("total inuse blocks    : %zu\n",lVar4);
  return;
}

Assistant:

void mi_debug_show_arenas(void) mi_attr_noexcept {
  const bool show_inuse = true;
  size_t max_arenas = mi_atomic_load_relaxed(&mi_arena_count);
  size_t inuse_total = 0;
  //size_t abandoned_total = 0;
  //size_t purge_total = 0;
  for (size_t i = 0; i < max_arenas; i++) {
    mi_arena_t* arena = mi_atomic_load_ptr_relaxed(mi_arena_t, &mi_arenas[i]);
    if (arena == NULL) break;
    _mi_message("arena %zu: %zu blocks of size %zuMiB (in %zu fields) %s\n", i, arena->block_count, MI_ARENA_BLOCK_SIZE / MI_MiB, arena->field_count, (arena->memid.is_pinned ? ", pinned" : ""));
    if (show_inuse) {
      inuse_total += mi_debug_show_bitmap("  ", "inuse blocks", arena->block_count, arena->blocks_inuse, arena->field_count);
    }
    if (arena->blocks_committed != NULL) {
      mi_debug_show_bitmap("  ", "committed blocks", arena->block_count, arena->blocks_committed, arena->field_count);
    }
    //if (show_abandoned) {
    //  abandoned_total += mi_debug_show_bitmap("  ", "abandoned blocks", arena->block_count, arena->blocks_abandoned, arena->field_count);
    //}
    //if (show_purge && arena->blocks_purge != NULL) {
    //  purge_total += mi_debug_show_bitmap("  ", "purgeable blocks", arena->block_count, arena->blocks_purge, arena->field_count);
    //}
  }
  if (show_inuse)     _mi_message("total inuse blocks    : %zu\n", inuse_total);
  //if (show_abandoned) _mi_message("total abandoned blocks: %zu\n", abandoned_total);
  //if (show_purge)     _mi_message("total purgeable blocks: %zu\n", purge_total);
}